

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,QEasingCurve *easing)

{
  QEasingCurvePrivate *pQVar1;
  QEasingCurveFunction *func;
  Type type;
  long in_FS_OFFSET;
  bool hasConfig;
  quint64 ptr_func;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  quint8 int_type;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  int_type = 0xaa;
  QDataStream::operator>>(stream,(qint8 *)&int_type);
  type = (Type)int_type;
  if (int_type == '/') {
    ptr_func._0_4_ = 2;
    local_3c = 0;
    ptr_func._4_4_ = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_38 = "default";
    type = Linear;
    QMessageLogger::warning
              ((QMessageLogger *)&ptr_func,
               "QEasingCurve: Cannot deserialize an easing curve with a custom easing function");
    QDataStream::setStatus(stream,ReadCorruptData);
  }
  QEasingCurve::setType(easing,type);
  ptr_func._0_4_ = 0xaaaaaaaa;
  ptr_func._4_4_ = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(qint64 *)&ptr_func);
  hasConfig = true;
  QDataStream::operator>>(stream,&hasConfig);
  pQVar1 = easing->d_ptr;
  if (pQVar1->config != (QEasingCurveFunction *)0x0) {
    (*pQVar1->config->_vptr_QEasingCurveFunction[1])();
    pQVar1 = easing->d_ptr;
  }
  pQVar1->config = (QEasingCurveFunction *)0x0;
  if (hasConfig == true) {
    func = curveToFunctionObject(type);
    operator>>(stream,func);
    easing->d_ptr->config = func;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QEasingCurve &easing)
{
    QEasingCurve::Type type;
    quint8 int_type;
    stream >> int_type;
    type = static_cast<QEasingCurve::Type>(int_type);
    if (type == QEasingCurve::Custom) {
        qWarning("QEasingCurve: Cannot deserialize an easing curve with a custom easing function");
        stream.setStatus(QDataStream::ReadCorruptData);
        type = QEasingCurve::Linear;
    }
    easing.setType(type);

    // Unused; for backwards compatibility
    [[maybe_unused]] quint64 ptr_func;
    stream >> ptr_func;

    bool hasConfig;
    stream >> hasConfig;
    delete easing.d_ptr->config;
    easing.d_ptr->config = nullptr;
    if (hasConfig) {
        QEasingCurveFunction *config = curveToFunctionObject(type);
        stream >> config;
        easing.d_ptr->config = config;
    }
    return stream;
}